

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

ngram_file_type_t ngram_str_to_type(char *str_name)

{
  int32 iVar1;
  char *str_name_local;
  
  iVar1 = strcmp_nocase(str_name,"arpa");
  if (iVar1 == 0) {
    str_name_local._4_4_ = NGRAM_ARPA;
  }
  else {
    iVar1 = strcmp_nocase(str_name,"dmp");
    if ((iVar1 != 0) && (iVar1 = strcmp_nocase(str_name,"bin"), iVar1 != 0)) {
      return NGRAM_INVALID;
    }
    str_name_local._4_4_ = NGRAM_BIN;
  }
  return str_name_local._4_4_;
}

Assistant:

ngram_file_type_t
ngram_str_to_type(const char *str_name)
{
    if (0 == strcmp_nocase(str_name, "arpa"))
        return NGRAM_ARPA;
    if (0 == strcmp_nocase(str_name, "dmp")
        || 0 == strcmp_nocase(str_name, "bin"))
        return NGRAM_BIN;
    return NGRAM_INVALID;
}